

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

mchunkptr mmap_resize(mstate m,mchunkptr oldp,size_t nb,int flags)

{
  ulong uVar1;
  size_t psize;
  mchunkptr newp;
  char *cp;
  size_t newmmsize;
  size_t oldmmsize;
  size_t offset;
  size_t oldsize;
  int flags_local;
  size_t nb_local;
  mchunkptr oldp_local;
  mstate m_local;
  
  uVar1 = oldp->head & 0xfffffffffffffff8;
  if (nb >> 3 < 0x20) {
    m_local = (mstate)0x0;
  }
  else if ((uVar1 < nb + 8) || (m_local = (mstate)oldp, mparams.granularity * 2 < uVar1 - nb)) {
    m_local = (mstate)0x0;
  }
  return (mchunkptr)m_local;
}

Assistant:

static mchunkptr mmap_resize(mstate m, mchunkptr oldp, size_t nb, int flags) {
  size_t oldsize = chunksize(oldp);
  (void)flags; /* placate people compiling -Wunused */
  if (is_small(nb)) /* Can't shrink mmap regions below small size */
    return 0;
  /* Keep old chunk if big enough but not too big */
  if (oldsize >= nb + SIZE_T_SIZE &&
      (oldsize - nb) <= (mparams.granularity << 1))
    return oldp;
  else {
    size_t offset = oldp->prev_foot;
    size_t oldmmsize = oldsize + offset + MMAP_FOOT_PAD;
    size_t newmmsize = mmap_align(nb + SIX_SIZE_T_SIZES + CHUNK_ALIGN_MASK);
    char* cp = (char*)CALL_MREMAP((char*)oldp - offset,
                                  oldmmsize, newmmsize, flags);
    if (cp != CMFAIL) {
      mchunkptr newp = (mchunkptr)(cp + offset);
      size_t psize = newmmsize - offset - MMAP_FOOT_PAD;
      newp->head = psize;
      mark_inuse_foot(m, newp, psize);
      chunk_plus_offset(newp, psize)->head = FENCEPOST_HEAD;
      chunk_plus_offset(newp, psize+SIZE_T_SIZE)->head = 0;

      if (cp < m->least_addr)
        m->least_addr = cp;
      if ((m->footprint += newmmsize - oldmmsize) > m->max_footprint)
        m->max_footprint = m->footprint;
      check_mmapped_chunk(m, newp);
      return newp;
    }
  }
  return 0;
}